

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O1

void MWT::predict_or_learn<true,false,true>(mwt *c,single_learner *base,example *ec)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  float *pfVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  vw *pvVar7;
  ulong uVar8;
  double dVar9;
  cb_class *pcVar10;
  uint32_t *puVar11;
  cb_class *cl;
  long lVar12;
  uchar *puVar13;
  uint64_t *puVar14;
  ulong uVar15;
  ulong *puVar16;
  unsigned_long *puVar17;
  policy_data *ppVar18;
  features *pfVar19;
  float *pfVar20;
  features *pfVar21;
  features *pfVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte bVar25;
  v_array<unsigned_char> *__range3;
  v_array<float> preds;
  v_array<float> local_d8;
  single_learner *local_b8;
  byte *local_b0;
  v_array<unsigned_char> *local_a8;
  byte *local_a0;
  float local_98 [24];
  float local_38;
  
  bVar25 = 0;
  for (pcVar10 = (cb_class *)(ec->l).cs.costs._begin; pcVar10 != (cb_class *)(ec->l).cs.costs._end;
      pcVar10 = pcVar10 + 1) {
    if ((pcVar10 == (cb_class *)0x0) ||
       (((pcVar10->cost == 3.4028235e+38 && (!NAN(pcVar10->cost))) ||
        (bVar2 = true, pcVar10->probability <= 0.0)))) {
      bVar2 = false;
    }
    if (bVar2) goto LAB_001b63df;
  }
  pcVar10 = (cb_class *)0x0;
LAB_001b63df:
  c->observation = pcVar10;
  local_b8 = base;
  if (pcVar10 != (cb_class *)0x0) {
    c->total = c->total + 1.0;
    pbVar23 = (ec->super_example_predict).indices._end;
    for (pbVar24 = (ec->super_example_predict).indices._begin; pbVar24 != pbVar23;
        pbVar24 = pbVar24 + 1) {
      bVar1 = *pbVar24;
      if (c->namespaces[bVar1] == true) {
        pfVar20 = (ec->super_example_predict).feature_space[bVar1].values._begin;
        pfVar4 = (ec->super_example_predict).feature_space[bVar1].values._end;
        if (pfVar20 != pfVar4) {
          puVar14 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
          do {
            value_policy(c,*pfVar20,*puVar14);
            pfVar20 = pfVar20 + 1;
            puVar14 = puVar14 + 1;
          } while (pfVar20 != pfVar4);
        }
      }
    }
    puVar5 = (c->policies)._end;
    for (puVar17 = (c->policies)._begin; puVar17 != puVar5; puVar17 = puVar17 + 1) {
      uVar6 = *puVar17;
      ppVar18 = (c->evals)._begin;
      pcVar10 = c->observation;
      dVar9 = 0.0;
      if (pcVar10->action == ppVar18[uVar6].action) {
        dVar9 = (double)(pcVar10->cost / pcVar10->probability);
      }
      ppVar18 = ppVar18 + uVar6;
      ppVar18->cost = dVar9 + ppVar18->cost;
      (c->evals)._begin[uVar6].action = 0;
    }
  }
  local_a8 = &c->indices;
  v_array<unsigned_char>::clear(local_a8);
  pvVar7 = c->all;
  bVar2 = (pvVar7->weights).sparse;
  puVar14 = &(pvVar7->weights).dense_weights._weight_mask;
  if (bVar2 != false) {
    puVar14 = &(pvVar7->weights).sparse_weights._weight_mask;
  }
  pbVar24 = (ec->super_example_predict).indices._begin;
  pbVar23 = (ec->super_example_predict).indices._end;
  if (pbVar24 != pbVar23) {
    uVar8 = *puVar14;
    puVar11 = &(pvVar7->weights).dense_weights._stride_shift;
    if (bVar2 != false) {
      puVar11 = &(pvVar7->weights).sparse_weights._stride_shift;
    }
    uVar3 = *puVar11;
    local_b0 = pbVar23;
    do {
      local_d8._begin._0_4_ = CONCAT31(local_d8._begin._1_3_,*pbVar24);
      if (c->namespaces[*pbVar24] == true) {
        local_a0 = pbVar24;
        v_array<unsigned_char>::push_back(local_a8,(uchar *)&local_d8);
        features::clear(c->feature_space + (byte)local_d8._begin);
        uVar15 = (ulong)(byte)local_d8._begin;
        pfVar20 = (ec->super_example_predict).feature_space[uVar15].values._begin;
        pfVar4 = (ec->super_example_predict).feature_space[uVar15].values._end;
        if (pfVar20 != pfVar4) {
          puVar16 = (ec->super_example_predict).feature_space[uVar15].indicies._begin;
          do {
            uVar15 = (ulong)*pfVar20;
            features::push_back(c->feature_space + (byte)local_d8._begin,1.0,
                                ((long)(*pfVar20 - 9.223372e+18) & (long)uVar15 >> 0x3f | uVar15) +
                                (ulong)c->num_classes * ((*puVar16 & uVar8) >> ((byte)uVar3 & 0x3f))
                                << ((byte)uVar3 & 0x3f));
            pfVar20 = pfVar20 + 1;
            puVar16 = puVar16 + 1;
          } while (pfVar20 != pfVar4);
        }
        uVar15 = (ulong)(byte)local_d8._begin;
        pfVar22 = (ec->super_example_predict).feature_space + uVar15;
        pfVar19 = c->feature_space + uVar15;
        pfVar20 = local_98;
        for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
          *(float **)pfVar20 = (pfVar19->values)._begin;
          pfVar19 = (features *)((long)pfVar19 + (ulong)bVar25 * -0x10 + 8);
          pfVar20 = pfVar20 + ((ulong)bVar25 * -2 + 1) * 2;
        }
        pfVar19 = pfVar22;
        pfVar21 = c->feature_space + uVar15;
        for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pfVar21->values)._begin = (pfVar19->values)._begin;
          pfVar19 = (features *)((long)pfVar19 + ((ulong)bVar25 * -2 + 1) * 8);
          pfVar21 = (features *)((long)pfVar21 + (ulong)bVar25 * -0x10 + 8);
        }
        c->feature_space[uVar15].sum_feat_sq =
             (ec->super_example_predict).feature_space[uVar15].sum_feat_sq;
        pfVar20 = local_98;
        for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pfVar22->values)._begin = *(float **)pfVar20;
          pfVar20 = pfVar20 + ((ulong)bVar25 * -2 + 1) * 2;
          pfVar22 = (features *)((long)pfVar22 + ((ulong)bVar25 * -2 + 1) * 8);
        }
        (ec->super_example_predict).feature_space[uVar15].sum_feat_sq = local_38;
        pbVar24 = local_a0;
        pbVar23 = local_b0;
      }
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 != pbVar23);
  }
  local_d8._begin._0_4_ = (ec->pred).multiclass;
  local_d8._begin._4_4_ = *(undefined4 *)((long)&ec->pred + 4);
  local_d8._end._0_4_ = *(undefined4 *)((long)&ec->pred + 8);
  local_d8._end._4_4_ = *(undefined4 *)((long)&ec->pred + 0xc);
  local_d8.end_array._0_4_ = *(undefined4 *)((long)&ec->pred + 0x10);
  local_d8.end_array._4_4_ = *(undefined4 *)((long)&ec->pred + 0x14);
  local_d8.erase_count._0_4_ = *(undefined4 *)((long)&ec->pred + 0x18);
  local_d8.erase_count._4_4_ = *(undefined4 *)((long)&ec->pred + 0x1c);
  (**(code **)(local_b8 + 0x28))
            (*(undefined8 *)(local_b8 + 0x18),*(undefined8 *)(local_b8 + 0x20),ec);
  puVar13 = (c->indices)._end;
  if (puVar13 != (c->indices)._begin) {
    do {
      (c->indices)._end = puVar13 + -1;
      bVar1 = puVar13[-1];
      pfVar22 = (ec->super_example_predict).feature_space + bVar1;
      pfVar19 = c->feature_space + bVar1;
      pfVar20 = local_98;
      for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(float **)pfVar20 = (pfVar19->values)._begin;
        pfVar19 = (features *)((long)pfVar19 + (ulong)bVar25 * -0x10 + 8);
        pfVar20 = pfVar20 + ((ulong)bVar25 * -2 + 1) * 2;
      }
      pfVar19 = pfVar22;
      pfVar21 = c->feature_space + bVar1;
      for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pfVar21->values)._begin = (pfVar19->values)._begin;
        pfVar19 = (features *)((long)pfVar19 + ((ulong)bVar25 * -2 + 1) * 8);
        pfVar21 = (features *)((long)pfVar21 + (ulong)bVar25 * -0x10 + 8);
      }
      c->feature_space[bVar1].sum_feat_sq =
           (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
      pfVar20 = local_98;
      for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pfVar22->values)._begin = *(float **)pfVar20;
        pfVar20 = pfVar20 + ((ulong)bVar25 * -2 + 1) * 2;
        pfVar22 = (features *)((long)pfVar22 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      (ec->super_example_predict).feature_space[bVar1].sum_feat_sq = local_38;
      puVar13 = (c->indices)._end;
    } while (puVar13 != (c->indices)._begin);
  }
  v_array<float>::clear(&local_d8);
  local_98[0] = (float)(ec->pred).multiclass;
  v_array<float>::push_back(&local_d8,local_98);
  puVar17 = (c->policies)._begin;
  puVar5 = (c->policies)._end;
  if (puVar17 != puVar5) {
    do {
      local_98[0] = (float)(c->evals)._begin[*puVar17].cost / (float)c->total;
      v_array<float>::push_back(&local_d8,local_98);
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar5);
  }
  (ec->pred).scalars.end_array =
       (float *)CONCAT44(local_d8.end_array._4_4_,local_d8.end_array._0_4_);
  (ec->pred).scalars.erase_count =
       CONCAT44(local_d8.erase_count._4_4_,(undefined4)local_d8.erase_count);
  (ec->pred).scalars._begin = (float *)CONCAT44(local_d8._begin._4_4_,(uint32_t)local_d8._begin);
  (ec->pred).scalars._end = (float *)CONCAT44(local_d8._end._4_4_,local_d8._end._0_4_);
  return;
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}